

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bound_function_pointer_kernel_1.h
# Opt level: O0

void __thiscall dlib::bound_function_pointer::clear(bound_function_pointer *this)

{
  bound_function_pointer *in_stack_00000008;
  bound_function_pointer *in_stack_00000010;
  bound_function_pointer *in_stack_ffffffffffffffe0;
  
  bound_function_pointer(in_stack_ffffffffffffffe0);
  swap(in_stack_00000010,in_stack_00000008);
  ~bound_function_pointer((bound_function_pointer *)0x29e984);
  return;
}

Assistant:

void clear (
        ) { bound_function_pointer().swap(*this); }